

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetTestPropertyCommand::InitialPass
          (cmGetTestPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *testName;
  pointer pbVar1;
  cmTest *this_00;
  char *value;
  cmMakefile *this_01;
  ulong uVar2;
  allocator<char> local_41;
  string local_40;
  
  testName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)testName;
  if (uVar2 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    goto LAB_001b056d;
  }
  this_00 = cmMakefile::GetTest((this->super_cmCommand).Makefile,testName);
  if ((this_00 == (cmTest *)0x0) ||
     (pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start, pbVar1[1]._M_string_length == 0)) {
LAB_001b055a:
    this_01 = (this->super_cmCommand).Makefile;
    value = "NOTFOUND";
  }
  else {
    value = cmTest::GetProperty(this_00,pbVar1 + 1);
    if (value == (char *)0x0) goto LAB_001b055a;
    this_01 = (this->super_cmCommand).Makefile;
  }
  cmMakefile::AddDefinition(this_01,testName + 2,value);
LAB_001b056d:
  return 0x40 < uVar2;
}

Assistant:

bool cmGetTestPropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& testName = args[0];
  std::string const& var = args[2];
  cmTest* test = this->Makefile->GetTest(testName);
  if (test) {
    const char* prop = nullptr;
    if (!args[1].empty()) {
      prop = test->GetProperty(args[1]);
    }
    if (prop) {
      this->Makefile->AddDefinition(var, prop);
      return true;
    }
  }
  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}